

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MatrixBandPartLayerParams::MergeFrom
          (MatrixBandPartLayerParams *this,MatrixBandPartLayerParams *from)

{
  LogMessage *other;
  int64 iVar1;
  InternalMetadataWithArenaLite *this_00;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  MatrixBandPartLayerParams *local_58;
  MatrixBandPartLayerParams *from_local;
  MatrixBandPartLayerParams *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xcf2b);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (MatrixBandPartLayerParams *)&local_58->_internal_metadata_;
  local_40 = this_00;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_00,&local_20->unknown_fields);
  }
  iVar1 = numlower(local_58);
  if (iVar1 != 0) {
    iVar1 = numlower(local_58);
    set_numlower(this,iVar1);
  }
  iVar1 = numupper(local_58);
  if (iVar1 != 0) {
    iVar1 = numupper(local_58);
    set_numupper(this,iVar1);
  }
  return;
}

Assistant:

void MatrixBandPartLayerParams::MergeFrom(const MatrixBandPartLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MatrixBandPartLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.numlower() != 0) {
    set_numlower(from.numlower());
  }
  if (from.numupper() != 0) {
    set_numupper(from.numupper());
  }
}